

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcessing.cpp
# Opt level: O1

Mat * preprocessImage(Mat *img,int numRows,int numCols)

{
  long lVar1;
  char cVar2;
  int in_ECX;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  undefined4 in_register_00000034;
  Mat *pMVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  bool bVar15;
  Mat *cloneImg;
  Mat region;
  Mat newImg;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  countours;
  Rect bnd;
  Mat temp;
  Rect rec;
  Mat realClone;
  uint local_388;
  uint local_384;
  double local_380;
  Range local_368;
  Mat *local_360;
  undefined8 uStack_358;
  undefined8 local_308;
  int local_300;
  int local_2fc;
  Size local_2f8;
  long *local_2c0;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_2a8;
  _InputArray local_290 [4];
  int local_230;
  undefined8 local_228;
  int local_220;
  Mat local_218 [96];
  int local_1b8 [2];
  int local_1b0;
  int local_1ac;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  _InputArray *local_1a0;
  undefined8 local_198 [12];
  Mat local_138 [96];
  Mat local_d8 [144];
  undefined4 local_48;
  Mat *local_40;
  undefined8 uStack_38;
  
  pMVar9 = (Mat *)CONCAT44(in_register_00000034,numRows);
  cv::Mat::Mat(local_218);
  if ((int)*(uint *)(pMVar9 + 8) < 1) {
    local_388 = 0xffffffff;
    local_380._0_4_ = -1;
    local_384 = 0xffffffff;
    iVar6 = -1;
  }
  else {
    uVar7 = *(uint *)(pMVar9 + 8) >> 1;
    iVar14 = -uVar7;
    iVar6 = -1;
    local_384 = 0xffffffff;
    local_380._0_4_ = -1;
    local_388 = 0xffffffff;
    do {
      if (local_384 == 0xffffffff) {
        local_308._4_4_ = uVar7 + 1;
        local_308._0_4_ = uVar7;
        local_368.start = -0x80000000;
        local_368.end = 0x7fffffff;
        cv::Mat::Mat((Mat *)&local_1a8,pMVar9,(Range *)&local_308,&local_368);
        cv::Mat::operator=(local_218,(Mat *)&local_1a8);
        cv::Mat::~Mat((Mat *)&local_1a8);
        cv::Mat::Mat((Mat *)&local_1a8,local_218);
        uStack_358 = 0;
        local_368.start = 0x1010000;
        local_360 = (Mat *)&local_1a8;
        cv::sum((_InputArray *)&local_308);
        if (((double)local_308 < 50.0) ||
           (local_384 = 0xffffffff, uVar7 == *(int *)(pMVar9 + 8) - 1U)) {
          local_384 = uVar7;
        }
        cv::Mat::~Mat((Mat *)&local_1a8);
      }
      if (iVar6 == -1) {
        local_308._4_4_ = *(int *)(pMVar9 + 8) + iVar14 + 1;
        local_308._0_4_ = iVar14 + *(int *)(pMVar9 + 8);
        local_368.start = -0x80000000;
        local_368.end = 0x7fffffff;
        cv::Mat::Mat((Mat *)&local_1a8,pMVar9,(Range *)&local_308,&local_368);
        cv::Mat::operator=(local_218,(Mat *)&local_1a8);
        cv::Mat::~Mat((Mat *)&local_1a8);
        cv::Mat::Mat((Mat *)&local_1a8,local_218);
        uStack_358 = 0;
        local_368.start = 0x1010000;
        local_360 = (Mat *)&local_1a8;
        cv::sum((_InputArray *)&local_308);
        if (((double)local_308 < 50.0) || (iVar6 = -1, uVar7 == *(int *)(pMVar9 + 8) - 1U)) {
          iVar6 = *(int *)(pMVar9 + 8) + iVar14;
        }
        cv::Mat::~Mat((Mat *)&local_1a8);
      }
      if (local_388 == 0xffffffff) {
        local_308._0_4_ = -0x80000000;
        local_308._4_4_ = 0x7fffffff;
        local_368.end = uVar7 + 1;
        local_368.start = uVar7;
        cv::Mat::Mat((Mat *)&local_1a8,pMVar9,(Range *)&local_308,&local_368);
        cv::Mat::operator=(local_218,(Mat *)&local_1a8);
        cv::Mat::~Mat((Mat *)&local_1a8);
        cv::Mat::Mat((Mat *)&local_1a8,local_218);
        uStack_358 = 0;
        local_368.start = 0x1010000;
        local_360 = (Mat *)&local_1a8;
        cv::sum((_InputArray *)&local_308);
        if (((double)local_308 < 50.0) ||
           (local_388 = 0xffffffff, uVar7 == *(int *)(pMVar9 + 0xc) - 1U)) {
          local_388 = uVar7;
        }
        cv::Mat::~Mat((Mat *)&local_1a8);
      }
      if (local_380._0_4_ == -1) {
        local_368.start = iVar14 + *(int *)(pMVar9 + 0xc);
        local_308._0_4_ = -0x80000000;
        local_308._4_4_ = 0x7fffffff;
        local_368.end = *(int *)(pMVar9 + 0xc) + iVar14 + 1;
        cv::Mat::Mat((Mat *)&local_1a8,pMVar9,(Range *)&local_308,&local_368);
        cv::Mat::operator=(local_218,(Mat *)&local_1a8);
        cv::Mat::~Mat((Mat *)&local_1a8);
        cv::Mat::Mat((Mat *)&local_1a8,local_218);
        uStack_358 = 0;
        local_368.start = 0x1010000;
        local_360 = (Mat *)&local_1a8;
        cv::sum((_InputArray *)&local_308);
        if (((double)local_308 < 50.0) ||
           (local_380._0_4_ = -1, uVar7 == *(int *)(pMVar9 + 0xc) - 1U)) {
          local_380._0_4_ = *(int *)(pMVar9 + 0xc) + iVar14;
        }
        cv::Mat::~Mat((Mat *)&local_1a8);
      }
      uVar7 = uVar7 + 1;
      iVar14 = iVar14 + -1;
    } while ((int)uVar7 < *(int *)(pMVar9 + 8));
  }
  cv::Mat::Mat((Mat *)&local_308);
  cv::Mat::zeros((int)&local_1a8,*(int *)(pMVar9 + 8),*(int *)(pMVar9 + 0xc));
  (**(code **)(*(long *)CONCAT44(uStack_1a4,local_1a8) + 0x18))
            ((long *)CONCAT44(uStack_1a4,local_1a8),&local_1a8,&local_308,0xffffffff);
  cv::Mat::~Mat(local_d8);
  cv::Mat::~Mat(local_138);
  cv::Mat::~Mat((Mat *)local_198);
  iVar10 = local_300 / 2;
  iVar14 = (int)(local_384 - iVar6) / 2;
  if (iVar10 - iVar14 < iVar10 + iVar14) {
    iVar4 = (int)(local_388 - local_380._0_4_) / 2;
    iVar3 = local_2fc / 2 - iVar4;
    lVar11 = (long)-iVar14 + (long)iVar10;
    do {
      if (iVar3 < local_2fc / 2 + iVar4) {
        lVar1 = *local_2c0;
        lVar13 = (long)iVar3;
        iVar12 = local_380._0_4_;
        do {
          *(undefined1 *)(lVar1 * lVar11 + (long)local_2f8 + lVar13) =
               *(undefined1 *)
                ((long)iVar12 +
                **(long **)(pMVar9 + 0x48) * (long)((iVar6 - (iVar10 - iVar14)) + (int)lVar11) +
                *(long *)(pMVar9 + 0x10));
          lVar13 = lVar13 + 1;
          iVar12 = iVar12 + 1;
        } while (lVar13 < local_2fc / 2 + iVar4);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < local_300 / 2 + iVar14);
  }
  cv::Mat::Mat(img,numCols,in_ECX,0);
  local_198[0] = 0;
  local_1a8 = 0x1010000;
  uStack_358 = 0;
  local_368.start = 0x2010000;
  local_360 = img;
  local_220 = numCols;
  local_1a0 = (_InputArray *)&local_308;
  cv::resize(0);
  cv::Mat::clone();
  local_290[0].obj = &local_2a8;
  local_2a8.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar6 = 0;
  local_2a8.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_358 = 0;
  local_368.start = 0x1010000;
  local_290[0].sz.width = 0;
  local_290[0].sz.height = 0;
  local_290[0].flags = -0x7dfbfff4;
  local_228 = 0;
  local_360 = img;
  cv::findContours(&local_368,local_290,1);
  local_1b8[1] = 0;
  local_1b0 = 0;
  local_1ac = 0;
  if (local_2a8.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_2a8.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_380 = 0.0;
    local_1ac = 0;
    local_1b0 = 0;
    local_1b8[1] = 0;
    iVar6 = 0;
    uVar5 = 0;
    uVar8 = 1;
    do {
      local_360 = (Mat *)(local_2a8.
                          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar5 * 0x18);
      uStack_358 = 0;
      local_368.start = -0x7efcfff4;
      cv::boundingRect(local_290);
      if (local_380 < (double)((int)local_290[0].obj * local_290[0].obj._4_4_)) {
        local_1b8[1] = local_290[0]._4_4_;
        local_1b0 = (int)local_290[0].obj;
        local_1ac = local_290[0].obj._4_4_;
        iVar6 = local_290[0].flags;
        local_380 = (double)((int)local_290[0].obj * local_290[0].obj._4_4_);
      }
      uVar5 = ((long)local_2a8.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_2a8.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      bVar15 = uVar8 <= uVar5;
      lVar11 = uVar5 - uVar8;
      uVar5 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar15 && lVar11 != 0);
  }
  local_1b8[0] = iVar6;
  cv::Mat::Mat((Mat *)&local_368,(Mat *)&local_1a8,(Rect_ *)local_1b8);
  cVar2 = cv::Mat::empty();
  if (cVar2 == '\0') {
    local_290[0].sz.width = 0;
    local_290[0].sz.height = 0;
    local_290[0].flags = 0x1010000;
    uStack_38 = 0;
    local_48 = 0x2010000;
    local_290[0].obj = &local_368;
    local_230 = numCols;
    local_40 = img;
    cv::resize(0);
  }
  local_290[0].sz.width = 0;
  local_290[0].sz.height = 0;
  local_290[0].flags = 0x2010000;
  local_290[0].obj = img;
  cv::Mat::convertTo((_OutputArray *)img,(int)local_290,0.00392156862745098,0.0);
  cv::Mat::reshape((int)local_290,(int)img);
  cv::Mat::operator=(img,(Mat *)local_290);
  cv::Mat::~Mat((Mat *)local_290);
  cv::Mat::~Mat((Mat *)&local_368);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_2a8);
  cv::Mat::~Mat((Mat *)&local_1a8);
  cv::Mat::~Mat((Mat *)&local_308);
  cv::Mat::~Mat(local_218);
  return img;
}

Assistant:

Mat preprocessImage(Mat img, int numRows, int numCols)
{

    
    int rowTop=-1, rowBottom=-1, colLeft=-1, colRight=-1;

    Mat temp;
    int thresholdBottom = 50;
    int thresholdTop = 50;
    int thresholdLeft = 50;
    int thresholdRight = 50;
    int center = img.rows/2;
    for(int i=center;i<img.rows;i++){
        if(rowBottom==-1)
        {
            temp = img.row(i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdBottom || i==img.rows-1)
                rowBottom = i;

        }

        if(rowTop==-1)
        {
            temp = img.row(img.rows-i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdTop || i==img.rows-1)
                rowTop = img.rows-i;

        }
        if(colRight==-1)
        {
            temp = img.col(i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdRight|| i==img.cols-1)
                colRight = i;

        }

        if(colLeft==-1)
        {
            temp = img.col(img.cols-i);
            Mat stub = temp;
            if(sum(stub).val[0] < thresholdLeft|| i==img.cols-1)
                colLeft = img.cols-i;
        }
    }
    Mat newImg;
    //newImg = img.clone();

    newImg = newImg.zeros(img.rows, img.cols, CV_8UC1);

    int startAtX = (newImg.cols/2)-(colRight-colLeft)/2;

    int startAtY = (newImg.rows/2)-(rowBottom-rowTop)/2;

    for(int y=startAtY;y<(newImg.rows/2)+(rowBottom-rowTop)/2;y++)
    {
        uchar *ptr = newImg.ptr<uchar>(y);
        for(int x=startAtX;x<(newImg.cols/2)+(colRight-colLeft)/2;x++)
        {
            ptr[x] = img.at<uchar>(rowTop+(y-startAtY),colLeft+(x-startAtX));
        }
    }
    Mat cloneImg = Mat(numRows, numCols, CV_8UC1);
    resize(newImg, cloneImg, Size(numRows, numCols), 0, 0 , INTER_NEAREST);
    // Now fill along the borders
    /*for(int i=0;i<cloneImg.rows;i++)
    {
        floodFill(cloneImg, Point(0, i), Scalar(0,0,0));

        floodFill(cloneImg, Point(cloneImg.cols-1, i), Scalar(0,0,0));

        floodFill(cloneImg, Point(i, 0), Scalar(0));
        floodFill(cloneImg, Point(i, cloneImg.rows-1), Scalar(0));
    }*/
    Mat realClone = cloneImg.clone();
    vector<vector<Point>> countours;
    findContours(cloneImg, countours, RETR_LIST, CHAIN_APPROX_SIMPLE);
    Rect prevb; double areaprev = 0; double area; 
    for(unsigned int i = 0; i<countours.size();i++){
        Rect bnd = boundingRect(countours[i]);
        area = bnd.height*bnd.width;
        if(area > areaprev){
            prevb = bnd;
            areaprev = area;
        }
    }
    Rect rec = prevb;
    Mat region = realClone(rec);
    if(!region.empty())
        resize(region, cloneImg, Size(numRows, numCols), 0, 0, INTER_NEAREST);   

    cloneImg.convertTo(cloneImg, CV_32FC1, 1.0/255.0 );
    //imshow("clone img", cloneImg);
    //waitKey(0);
    cloneImg = cloneImg.reshape(1,1);
    return cloneImg;
}